

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_len(uchar **p,uchar *start,size_t len)

{
  uchar *puVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  size_t len_local;
  uchar *start_local;
  uchar **p_local;
  
  uVar2 = (uchar)len;
  if (len < 0x80) {
    if ((long)*p - (long)start < 1) {
      p_local._4_4_ = -0x6c;
    }
    else {
      puVar1 = *p;
      *p = puVar1 + -1;
      puVar1[-1] = uVar2;
      p_local._4_4_ = 1;
    }
  }
  else if (len < 0x100) {
    if ((long)*p - (long)start < 2) {
      p_local._4_4_ = -0x6c;
    }
    else {
      puVar1 = *p;
      *p = puVar1 + -1;
      puVar1[-1] = uVar2;
      puVar1 = *p;
      *p = puVar1 + -1;
      puVar1[-1] = 0x81;
      p_local._4_4_ = 2;
    }
  }
  else {
    uVar3 = (uchar)(len >> 8);
    if (len < 0x10000) {
      if ((long)*p - (long)start < 3) {
        p_local._4_4_ = -0x6c;
      }
      else {
        puVar1 = *p;
        *p = puVar1 + -1;
        puVar1[-1] = uVar2;
        puVar1 = *p;
        *p = puVar1 + -1;
        puVar1[-1] = uVar3;
        puVar1 = *p;
        *p = puVar1 + -1;
        puVar1[-1] = 0x82;
        p_local._4_4_ = 3;
      }
    }
    else {
      uVar4 = (uchar)(len >> 0x10);
      if (len < 0x1000000) {
        if ((long)*p - (long)start < 4) {
          p_local._4_4_ = -0x6c;
        }
        else {
          puVar1 = *p;
          *p = puVar1 + -1;
          puVar1[-1] = uVar2;
          puVar1 = *p;
          *p = puVar1 + -1;
          puVar1[-1] = uVar3;
          puVar1 = *p;
          *p = puVar1 + -1;
          puVar1[-1] = uVar4;
          puVar1 = *p;
          *p = puVar1 + -1;
          puVar1[-1] = 0x83;
          p_local._4_4_ = 4;
        }
      }
      else if (len < 0x100000000) {
        if ((long)*p - (long)start < 5) {
          p_local._4_4_ = -0x6c;
        }
        else {
          puVar1 = *p;
          *p = puVar1 + -1;
          puVar1[-1] = uVar2;
          puVar1 = *p;
          *p = puVar1 + -1;
          puVar1[-1] = uVar3;
          puVar1 = *p;
          *p = puVar1 + -1;
          puVar1[-1] = uVar4;
          puVar1 = *p;
          *p = puVar1 + -1;
          puVar1[-1] = (uchar)(len >> 0x18);
          puVar1 = *p;
          *p = puVar1 + -1;
          puVar1[-1] = 0x84;
          p_local._4_4_ = 5;
        }
      }
      else {
        p_local._4_4_ = -100;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_write_len( unsigned char **p, unsigned char *start, size_t len )
{
    if( len < 0x80 )
    {
        if( *p - start < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = (unsigned char) len;
        return( 1 );
    }

    if( len <= 0xFF )
    {
        if( *p - start < 2 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = (unsigned char) len;
        *--(*p) = 0x81;
        return( 2 );
    }

    if( len <= 0xFFFF )
    {
        if( *p - start < 3 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = ( len       ) & 0xFF;
        *--(*p) = ( len >>  8 ) & 0xFF;
        *--(*p) = 0x82;
        return( 3 );
    }

    if( len <= 0xFFFFFF )
    {
        if( *p - start < 4 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = ( len       ) & 0xFF;
        *--(*p) = ( len >>  8 ) & 0xFF;
        *--(*p) = ( len >> 16 ) & 0xFF;
        *--(*p) = 0x83;
        return( 4 );
    }

#if SIZE_MAX > 0xFFFFFFFF
    if( len <= 0xFFFFFFFF )
#endif
    {
        if( *p - start < 5 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = ( len       ) & 0xFF;
        *--(*p) = ( len >>  8 ) & 0xFF;
        *--(*p) = ( len >> 16 ) & 0xFF;
        *--(*p) = ( len >> 24 ) & 0xFF;
        *--(*p) = 0x84;
        return( 5 );
    }

#if SIZE_MAX > 0xFFFFFFFF
    return( MBEDTLS_ERR_ASN1_INVALID_LENGTH );
#endif
}